

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# naiveproxy.cpp
# Opt level: O3

int __thiscall naiveproxy::init_proxys(naiveproxy *this)

{
  size_t *psVar1;
  byte *pbVar2;
  __pid_t _Var3;
  FILE *__stream;
  char *pcVar4;
  ulong uVar5;
  naiveconfig *this_00;
  _List_node_base *p_Var6;
  tcpproxy *ptVar7;
  _func_int **pp_Var8;
  naiveproxy *pnVar9;
  httpproxy *this_01;
  byte *str_00;
  byte local_438 [8];
  char str [1024];
  
  signal(0x11,(__sighandler_t)0x1);
  __stream = fopen("/etc/naiveproxy.conf","r");
  if (__stream == (FILE *)0x0) {
    printf(anon_var_dwarf_1123d,"/etc/naiveproxy.conf");
LAB_00105b88:
    exit(0);
  }
  pcVar4 = fgets((char *)local_438,0x400,__stream);
  if (pcVar4 != (char *)0x0) {
    str_00 = local_438;
    do {
      while ((uVar5 = (ulong)*str_00, pbVar2 = str_00, uVar5 < 0x21 &&
             ((0x100000600U >> (uVar5 & 0x3f) & 1) != 0))) {
        str_00 = str_00 + 1;
      }
      while (((char)uVar5 != '\0' && ((int)uVar5 != 0x23))) {
        uVar5 = (ulong)pbVar2[1];
        pbVar2 = pbVar2 + 1;
      }
      *pbVar2 = 0;
      if (*str_00 != 0) {
        this_00 = (naiveconfig *)operator_new(0x38);
        naiveconfig::naiveconfig(this_00,(char *)str_00);
        p_Var6 = (_List_node_base *)operator_new(0x18);
        p_Var6[1]._M_next = (_List_node_base *)this_00;
        std::__detail::_List_node_base::_M_hook(p_Var6);
        psVar1 = &(this->cfgs).super__List_base<naiveconfig_*,_std::allocator<naiveconfig_*>_>.
                  _M_impl._M_node._M_size;
        *psVar1 = *psVar1 + 1;
      }
      str_00 = local_438;
      pcVar4 = fgets((char *)str_00,0x400,__stream);
    } while (pcVar4 != (char *)0x0);
  }
  p_Var6 = (this->cfgs).super__List_base<naiveconfig_*,_std::allocator<naiveconfig_*>_>._M_impl.
           _M_node.super__List_node_base._M_next;
  if (p_Var6 != (_List_node_base *)&this->cfgs) {
    do {
      if (this->daemonized == true) {
        _Var3 = fork();
        if (_Var3 == 0) {
          pnVar9 = GetInstance();
          std::__cxx11::list<naiveconfig_*,_std::allocator<naiveconfig_*>_>::clear(&pnVar9->cfgs);
          if (*(char *)((long)&p_Var6[1]._M_next[1]._M_next + 4) == '\0') {
            this_01 = (httpproxy *)operator_new(0x58);
            tcpproxy::tcpproxy((tcpproxy *)this_01,(naiveconfig *)p_Var6[1]._M_next);
          }
          else {
            this_01 = (httpproxy *)operator_new(0x90);
            httpproxy::httpproxy(this_01,(naiveconfig *)p_Var6[1]._M_next);
          }
          (*(this_01->super_tcpproxy).super_proxy._vptr_proxy[2])();
          goto LAB_00105b88;
        }
        if (_Var3 < 0) goto LAB_00105b88;
      }
      else {
        if (*(char *)((long)&p_Var6[1]._M_next[1]._M_next + 4) == '\0') {
          ptVar7 = (tcpproxy *)operator_new(0x58);
          tcpproxy::tcpproxy(ptVar7,(naiveconfig *)p_Var6[1]._M_next);
          pp_Var8 = (ptVar7->super_proxy)._vptr_proxy;
        }
        else {
          ptVar7 = (tcpproxy *)operator_new(0x90);
          tcpproxy::tcpproxy(ptVar7,(naiveconfig *)p_Var6[1]._M_next);
          (ptVar7->super_proxy)._vptr_proxy = (_func_int **)&PTR__httpproxy_00109ca8;
          ptVar7[1].super_proxy._vptr_proxy = (_func_int **)&ptVar7[1].sfh._M_h._M_before_begin;
          ptVar7[1].super_proxy.cfg = (naiveconfig *)0x1;
          *(undefined8 *)&ptVar7[1].epollfd = 0;
          ptVar7[1].events = (epoll_event *)0x0;
          *(undefined4 *)&ptVar7[1].sfh._M_h._M_buckets = 0x3f800000;
          ptVar7[1].sfh._M_h._M_bucket_count = 0;
          ptVar7[1].sfh._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          pp_Var8 = (_func_int **)&PTR__httpproxy_00109ca8;
        }
        (*pp_Var8[2])();
      }
      p_Var6 = p_Var6->_M_next;
    } while (p_Var6 != (_List_node_base *)&this->cfgs);
  }
  return 0;
}

Assistant:

int naiveproxy::init_proxys()
{

    //忽略SIGCHID
    signal(SIGCHLD, SIG_IGN);

    FILE *fp;
    fp = fopen(CONFIG_FILE_NAME, "r");
    if (fp == NULL)
    {
        printf("打开文件%s失败\n", CONFIG_FILE_NAME);
        exit(0);
    }

    char str[1024];

    while (fgets(str, sizeof(str), fp) != NULL)
    {
        char *p_str = str;
        //删除前导空格等
        while (*p_str == ' ' || *p_str == '\t' || *p_str == '\n')
            p_str++;
        //删除注释
        char *p = p_str;
        while (*p && *p != '#')
            p++;
        *p = 0;
        if (*p_str == 0)
            continue;

        naiveconfig *cfg = new naiveconfig(p_str);
        //由于是push_front，所以配置文件可以看做是从下往上处理的
        cfgs.push_front(cfg);
    }

    for (auto it = cfgs.begin(); it != cfgs.end(); it++)
    {
        if (daemonized)
        {
            pid_t pid;
            pid = fork();
            if (pid == 0)
            {
                //naiveproxy::DestroyInstance();
                naiveproxy::GetInstance()->cfgs.clear();
                //释放父进程打开的文件描述符和申请的cfgs空间。
                // for (int i = 3; i < NOFILE; i++)
                //     close(i);

                proxy *pro = NULL;
                if ((*it)->protocol == PROTOCOL_TCP)
                {
                    pro = new tcpproxy(*it);
                }
                else if ((*it)->protocol == PROTOCOL_UDP)
                {
                }
                else if ((*it)->protocol == PROTOCOL_HTTP)
                {
                    pro = new httpproxy(*it);
                }
                pro->startproxy();
                exit(0);
            }
            else if (pid < 0)
            {
                exit(0);
            }
        }
        else
        {

            proxy *pro = NULL;
            if ((*it)->protocol == PROTOCOL_TCP)
            {
                pro = new tcpproxy(*it);
            }
            else if ((*it)->protocol == PROTOCOL_UDP)
            {
            }
            else if ((*it)->protocol == PROTOCOL_HTTP)
            {
                pro = new httpproxy(*it);
            }
            pro->startproxy();
        }
    }
    return 0;
}